

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O0

int_t sLUMemInit(fact_t fact,void *work,int_t lwork,int m,int n,int_t annz,int panel_size,
                float fill_ratio,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,int **iwork,
                float **dwork)

{
  int iVar1;
  int_t iVar2;
  ExpHeader *pEVar3;
  bool bVar4;
  char local_1a8 [8];
  char msg [256];
  int local_9c;
  int local_98;
  int_t nzlumax;
  int_t nzumax;
  int_t nzlmax;
  int_t *xusub;
  int_t *usub;
  float *ucol;
  int_t *xlusup;
  float *lusup;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  NCformat *Ustore;
  SCformat *Lstore;
  int dword;
  int iword;
  int info;
  float fill_ratio_local;
  int_t annz_local;
  int n_local;
  int m_local;
  int_t lwork_local;
  void *work_local;
  fact_t fact_local;
  
  Lstore._4_4_ = 4;
  Lstore._0_4_ = 4;
  Glu->n = n;
  Glu->num_expansions = 0;
  iword = (int)fill_ratio;
  info = annz;
  fill_ratio_local = (float)n;
  annz_local = m;
  n_local = lwork;
  _m_local = work;
  work_local._0_4_ = fact;
  pEVar3 = (ExpHeader *)superlu_malloc(0x60);
  Glu->expanders = pEVar3;
  if (Glu->expanders == (ExpHeader *)0x0) {
    sprintf(local_1a8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for expanders",0xd4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/smemory.c");
    superlu_abort_and_exit(local_1a8);
  }
  if ((fact_t)work_local == SamePattern_SameRowPerm) {
    Ustore = (NCformat *)L->Store;
    xsup = (int *)U->Store;
    supno = Ustore[1].rowind;
    lsub = (int_t *)Ustore[1].nzval;
    lusup = *(float **)(Ustore + 1);
    ucol = (float *)Ustore->rowind;
    _nzumax = *(int_t **)(xsup + 6);
    nzlumax = Glu->nzlmax;
    local_98 = Glu->nzumax;
    local_9c = Glu->nzlumax;
    if (n_local == -1) {
      work_local._4_4_ =
           ((int)fill_ratio_local * 5 + 5) * Lstore._4_4_ +
           (panel_size * 2 + 7) * annz_local * 4 + (panel_size + 1) * annz_local * 4 +
           (nzlumax + local_98) * Lstore._4_4_ + (local_9c + local_98) * (int)Lstore +
           (int)fill_ratio_local;
    }
    else {
      if (n_local == 0) {
        Glu->MemModel = SYSTEM;
      }
      else {
        Glu->MemModel = USER;
        (Glu->stack).top2 = n_local / 4 << 2;
        (Glu->stack).size = (Glu->stack).top2;
      }
      xlsub = Ustore->colptr;
      Glu->expanders[2].mem = xlsub;
      xlusup = (int_t *)Ustore->nzval;
      Glu->expanders->mem = xlusup;
      xusub = *(int_t **)(xsup + 4);
      Glu->expanders[3].mem = xusub;
      usub = *(int_t **)(xsup + 2);
      Glu->expanders[1].mem = usub;
      Glu->expanders[2].size = nzlumax;
      Glu->expanders->size = local_9c;
      Glu->expanders[3].size = local_98;
      Glu->expanders[1].size = local_98;
LAB_0010a37f:
      Glu->xsup = supno;
      Glu->supno = lsub;
      Glu->lsub = xlsub;
      Glu->xlsub = (int_t *)lusup;
      Glu->lusup = xlusup;
      Glu->xlusup = (int_t *)ucol;
      Glu->ucol = usub;
      Glu->usub = xusub;
      Glu->xusub = _nzumax;
      Glu->nzlmax = nzlumax;
      Glu->nzumax = local_98;
      Glu->nzlumax = local_9c;
      iVar1 = sLUWorkInit(annz_local,(int)fill_ratio_local,panel_size,iwork,dwork,Glu);
      if (iVar1 == 0) {
        Glu->num_expansions = Glu->num_expansions + 1;
        work_local._4_4_ = 0;
      }
      else {
        dword = iVar1;
        iVar2 = smemory_usage(nzlumax,local_98,local_9c,(int)fill_ratio_local);
        work_local._4_4_ = iVar1 + iVar2 + (int)fill_ratio_local;
      }
    }
  }
  else {
    local_9c = (int)((float)iword * (float)info);
    if (n_local == -1) {
      work_local._4_4_ =
           ((int)fill_ratio_local * 5 + 5) * Lstore._4_4_ +
           (panel_size * 2 + 7) * annz_local * 4 + (panel_size + 1) * annz_local * 4 +
           local_9c * 2 * Lstore._4_4_ + local_9c * 2 * (int)Lstore + (int)fill_ratio_local;
    }
    else {
      local_98 = local_9c;
      nzlumax = local_9c;
      sSetupSpace(_m_local,n_local,Glu);
      if (Glu->MemModel == SYSTEM) {
        supno = int32Malloc((int)fill_ratio_local + 1);
        lsub = int32Malloc((int)fill_ratio_local + 1);
        lusup = (float *)intMalloc((int)fill_ratio_local + 1);
        ucol = (float *)intMalloc((int)fill_ratio_local + 1);
        _nzumax = intMalloc((int)fill_ratio_local + 1);
      }
      else {
        supno = (int *)suser_malloc(((int)fill_ratio_local + 1) * Lstore._4_4_,0,Glu);
        lsub = (int_t *)suser_malloc(((int)fill_ratio_local + 1) * Lstore._4_4_,0,Glu);
        lusup = (float *)suser_malloc(((int)fill_ratio_local + 1) * Lstore._4_4_,0,Glu);
        ucol = (float *)suser_malloc(((int)fill_ratio_local + 1) * Lstore._4_4_,0,Glu);
        _nzumax = (int_t *)suser_malloc(((int)fill_ratio_local + 1) * Lstore._4_4_,0,Glu);
      }
      xlusup = (int_t *)sexpand(&local_9c,LUSUP,0,0,Glu);
      usub = (int_t *)sexpand(&local_98,UCOL,0,0,Glu);
      xlsub = (int_t *)sexpand(&nzlumax,LSUB,0,0,Glu);
      xusub = (int_t *)sexpand(&local_98,USUB,0,1,Glu);
      while( true ) {
        bVar4 = true;
        if (((xlusup != (int_t *)0x0) && (bVar4 = true, usub != (int_t *)0x0)) &&
           (bVar4 = true, xlsub != (int_t *)0x0)) {
          bVar4 = xusub == (int_t *)0x0;
        }
        if (!bVar4) goto LAB_0010a37f;
        if (Glu->MemModel == SYSTEM) {
          superlu_free(xlusup);
          superlu_free(usub);
          superlu_free(xlsub);
          superlu_free(xusub);
        }
        else {
          suser_free((local_9c + local_98) * (int)Lstore + (nzlumax + local_98) * Lstore._4_4_,0,Glu
                    );
        }
        local_9c = local_9c / 2;
        local_98 = local_98 / 2;
        nzlumax = nzlumax / 2;
        if (local_9c < info) break;
        xlusup = (int_t *)sexpand(&local_9c,LUSUP,0,0,Glu);
        usub = (int_t *)sexpand(&local_98,UCOL,0,0,Glu);
        xlsub = (int_t *)sexpand(&nzlumax,LSUB,0,0,Glu);
        xusub = (int_t *)sexpand(&local_98,USUB,0,1,Glu);
      }
      printf("Not enough memory to perform factorization.\n");
      iVar2 = smemory_usage(nzlumax,local_98,local_9c,(int)fill_ratio_local);
      work_local._4_4_ = iVar2 + (int)fill_ratio_local;
    }
  }
  return work_local._4_4_;
}

Assistant:

int_t
sLUMemInit(fact_t fact, void *work, int_t lwork, int m, int n, int_t annz,
	  int panel_size, float fill_ratio, SuperMatrix *L, SuperMatrix *U,
          GlobalLU_t *Glu, int **iwork, float **dwork)
{
    int      info, iword, dword;
    SCformat *Lstore;
    NCformat *Ustore;
    int      *xsup, *supno;
    int_t    *lsub, *xlsub;
    float   *lusup;
    int_t    *xlusup;
    float   *ucol;
    int_t    *usub, *xusub;
    int_t    nzlmax, nzumax, nzlumax;
    
    iword     = sizeof(int);
    dword     = sizeof(float);
    Glu->n    = n;
    Glu->num_expansions = 0;

    Glu->expanders = (ExpHeader *) SUPERLU_MALLOC( NO_MEMTYPE *
                                                     sizeof(ExpHeader) );
    if ( !Glu->expanders ) ABORT("SUPERLU_MALLOC fails for expanders");
    
    if ( fact != SamePattern_SameRowPerm ) {
	/* Guess for L\U factors */
	nzumax = nzlumax = nzlmax = fill_ratio * annz;
	//nzlmax = SUPERLU_MAX(1, fill_ratio/4.) * annz;

	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else {
	    sSetupSpace(work, lwork, Glu);
	}
	
#if ( PRNTlevel >= 1 )
	printf("sLUMemInit() called: fill_ratio %.0f, nzlmax %lld, nzumax %lld\n", 
	       fill_ratio, (long long) nzlmax, (long long) nzumax);
	fflush(stdout);
#endif	
	
	/* Integer pointers for L\U factors */
	if ( Glu->MemModel == SYSTEM ) {
	    xsup   = int32Malloc(n+1);
	    supno  = int32Malloc(n+1);
	    xlsub  = intMalloc(n+1);
	    xlusup = intMalloc(n+1);
	    xusub  = intMalloc(n+1);
	} else {
	    xsup   = (int *)suser_malloc((n+1) * iword, HEAD, Glu);
	    supno  = (int *)suser_malloc((n+1) * iword, HEAD, Glu);
	    xlsub  = suser_malloc((n+1) * iword, HEAD, Glu);
	    xlusup = suser_malloc((n+1) * iword, HEAD, Glu);
	    xusub  = suser_malloc((n+1) * iword, HEAD, Glu);
	}

	lusup = (float *) sexpand( &nzlumax, LUSUP, 0, 0, Glu );
	ucol  = (float *) sexpand( &nzumax, UCOL, 0, 0, Glu );
	lsub  = (int_t *) sexpand( &nzlmax, LSUB, 0, 0, Glu );
	usub  = (int_t *) sexpand( &nzumax, USUB, 0, 1, Glu );

	while ( !lusup || !ucol || !lsub || !usub ) {
	    if ( Glu->MemModel == SYSTEM ) {
		SUPERLU_FREE(lusup); 
		SUPERLU_FREE(ucol); 
		SUPERLU_FREE(lsub); 
		SUPERLU_FREE(usub);
	    } else {
		suser_free((nzlumax+nzumax)*dword+(nzlmax+nzumax)*iword,
                            HEAD, Glu);
	    }
	    nzlumax /= 2;
	    nzumax /= 2;
	    nzlmax /= 2;
	    if ( nzlumax < annz ) {
		printf("Not enough memory to perform factorization.\n");
		return (smemory_usage(nzlmax, nzumax, nzlumax, n) + n);
	    }
#if ( PRNTlevel >= 1)
	    printf("sLUMemInit() reduce size: nzlmax %ld, nzumax %ld\n", 
		   (long) nzlmax, (long) nzumax);
	    fflush(stdout);
#endif
	    lusup = (float *) sexpand( &nzlumax, LUSUP, 0, 0, Glu );
	    ucol  = (float *) sexpand( &nzumax, UCOL, 0, 0, Glu );
	    lsub  = (int_t *) sexpand( &nzlmax, LSUB, 0, 0, Glu );
	    usub  = (int_t *) sexpand( &nzumax, USUB, 0, 1, Glu );
	}
	
    } else {
	/* fact == SamePattern_SameRowPerm */
	Lstore   = L->Store;
	Ustore   = U->Store;
	xsup     = Lstore->sup_to_col;
	supno    = Lstore->col_to_sup;
	xlsub    = Lstore->rowind_colptr;
	xlusup   = Lstore->nzval_colptr;
	xusub    = Ustore->colptr;
	nzlmax   = Glu->nzlmax;    /* max from previous factorization */
	nzumax   = Glu->nzumax;
	nzlumax  = Glu->nzlumax;
	
	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else if ( lwork == 0 ) {
	    Glu->MemModel = SYSTEM;
	} else {
	    Glu->MemModel = USER;
	    Glu->stack.top2 = (lwork/4)*4; /* must be word-addressable */
	    Glu->stack.size = Glu->stack.top2;
	}
	
	lsub  = Glu->expanders[LSUB].mem  = Lstore->rowind;
	lusup = Glu->expanders[LUSUP].mem = Lstore->nzval;
	usub  = Glu->expanders[USUB].mem  = Ustore->rowind;
	ucol  = Glu->expanders[UCOL].mem  = Ustore->nzval;;
	Glu->expanders[LSUB].size         = nzlmax;
	Glu->expanders[LUSUP].size        = nzlumax;
	Glu->expanders[USUB].size         = nzumax;
	Glu->expanders[UCOL].size         = nzumax;	
    }

    Glu->xsup    = xsup;
    Glu->supno   = supno;
    Glu->lsub    = lsub;
    Glu->xlsub   = xlsub;
    Glu->lusup   = (void *) lusup;
    Glu->xlusup  = xlusup;
    Glu->ucol    = (void *) ucol;
    Glu->usub    = usub;
    Glu->xusub   = xusub;
    Glu->nzlmax  = nzlmax;
    Glu->nzumax  = nzumax;
    Glu->nzlumax = nzlumax;
    
    info = sLUWorkInit(m, n, panel_size, iwork, dwork, Glu);
    if ( info )
	return ( info + smemory_usage(nzlmax, nzumax, nzlumax, n) + n);
    
    ++Glu->num_expansions;
    return 0;
    
}